

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRImageFromFile(EXRImage *exr_image,EXRHeader *exr_header,char *filename,char **err)

{
  reference __ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  string *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  allocator_type *in_stack_fffffffffffffe90;
  size_type in_stack_fffffffffffffe98;
  allocator<char> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  char **in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  uchar *in_stack_ffffffffffffff08;
  EXRHeader *in_stack_ffffffffffffff10;
  EXRImage *in_stack_ffffffffffffff18;
  string local_d8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  FILE *local_68;
  allocator<char> local_49;
  string local_48 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  int local_4;
  
  if (in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
    tinyexr::SetErrorMessage
              (in_stack_fffffffffffffe80,
               (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    local_4 = -3;
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    local_68 = fopen((char *)in_RDX,"rb");
    if (local_68 == (FILE *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_20,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      tinyexr::SetErrorMessage
                (in_stack_fffffffffffffe80,
                 (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator(&local_a9);
      local_4 = -7;
    }
    else {
      fseek(local_68,0,2);
      local_b8 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ftell(local_68);
      fseek(local_68,0,0);
      if (local_b8 < (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x10) {
        fclose(local_68);
        __s = &stack0xffffffffffffff07;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffec0,__s,(allocator<char> *)local_20);
        std::operator+(in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
        tinyexr::SetErrorMessage
                  (in_stack_fffffffffffffe80,
                   (char **)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::__cxx11::string::~string(local_d8);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
        local_4 = -5;
      }
      else {
        pvVar1 = local_b8;
        std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x17414e);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (pvVar1,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
        std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x17416e);
        __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                           &stack0xfffffffffffffee8,0);
        pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 fread(__ptr,1,(size_t)local_b8,local_68);
        if (pvVar1 != local_b8) {
          __assert_fail("ret == filesize",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/ThirdParty/tinyexr.h"
                        ,0x2ec6,
                        "int LoadEXRImageFromFile(EXRImage *, const EXRHeader *, const char *, const char **)"
                       );
        }
        fclose(local_68);
        pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                           (local_10,CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        local_4 = LoadEXRImageFromMemory
                            (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                             in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                             in_stack_fffffffffffffef8);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(pvVar1);
      }
    }
  }
  return local_4;
}

Assistant:

int LoadEXRImageFromFile(EXRImage *exr_image, const EXRHeader *exr_header,
                         const char *filename, const char **err) {
  if (exr_image == NULL) {
    tinyexr::SetErrorMessage("Invalid argument for LoadEXRImageFromFile", err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

#ifdef _WIN32
  FILE *fp = NULL;
  fopen_s(&fp, filename, "rb");
#else
  FILE *fp = fopen(filename, "rb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot read file " + std::string(filename), err);
    return TINYEXR_ERROR_CANT_OPEN_FILE;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = static_cast<size_t>(ftell(fp));
  fseek(fp, 0, SEEK_SET);

  if (filesize < 16) {
    fclose(fp);
    tinyexr::SetErrorMessage("File size too short " + std::string(filename),
                             err);
    return TINYEXR_ERROR_INVALID_FILE;
  }

  std::vector<unsigned char> buf(filesize);  // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    TEXR_ASSERT(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadEXRImageFromMemory(exr_image, exr_header, &buf.at(0), filesize,
                                err);
}